

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O0

void snga_dest_indices(Integer ndims,Integer *los,Integer *blos,Integer *dimss,Integer ndimd,
                      Integer *lod,Integer *blod,Integer *dimsd)

{
  Integer factor;
  Integer i;
  Integer idx;
  Integer *lod_local;
  Integer ndimd_local;
  Integer *dimss_local;
  Integer *blos_local;
  Integer *los_local;
  Integer ndims_local;
  
  idx = 0;
  factor = 1;
  for (i = 0; i < ndims; i = i + 1) {
    idx = (los[i] - blos[i]) * factor + idx;
    factor = dimss[i] * factor;
  }
  for (i = 0; i < ndims; i = i + 1) {
    lod[i] = idx % dimsd[i] + blod[i];
    idx = idx / dimsd[i];
  }
  return;
}

Assistant:

static void snga_dest_indices(Integer ndims, Integer *los, Integer *blos, Integer *dimss,
               Integer ndimd, Integer *lod, Integer *blod, Integer *dimsd)
{
    Integer idx = 0, i, factor=1;
        
    for(i=0;i<ndims;i++) {
        idx += (los[i] - blos[i])*factor;
        factor *= dimss[i];
    }
        
    for(i=0;i<ndims;i++) {
        lod[i] = idx % dimsd[i] + blod[i];
        idx /= dimsd[i];
    }
}